

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O2

GLuint hmi::anon_unknown_0::compile_shader(char *code,GLenum type)

{
  GLint GVar1;
  GLuint GVar2;
  ostream *poVar3;
  unique_ptr<char[],_std::default_delete<char[]>_> info_log;
  GLint info_log_length;
  GLint compile_status;
  char *source [1];
  
  GVar2 = (*glad_glCreateShader)(type);
  if (GVar2 != 0) {
    source[0] = code;
    (*glad_glShaderSource)(GVar2,1,source,(GLint *)0x0);
    (*glad_glCompileShader)(GVar2);
    compile_status = 0;
    (*glad_glGetShaderiv)(GVar2,0x8b81,&compile_status);
    if (compile_status != 0) {
      return GVar2;
    }
    info_log_length = 0;
    (*glad_glGetShaderiv)(GVar2,0x8b84,&info_log_length);
    GVar1 = info_log_length;
    if ((long)info_log_length < 1) {
      __assert_fail("info_log_length > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jube[P]std_hmi/src/renderer.cc"
                    ,0x46,"GLuint hmi::(anonymous namespace)::compile_shader(const char *, GLenum)")
      ;
    }
    info_log._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
         operator_new__((long)info_log_length);
    (*glad_glGetShaderInfoLog)
              (GVar2,GVar1,(GLsizei *)0x0,
               (GLchar *)
               info_log._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl);
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error while compiling shader: ");
    poVar3 = std::operator<<(poVar3,(char *)info_log._M_t.
                                            super___uniq_ptr_impl<char,_std::default_delete<char[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>
                                            .super__Head_base<0UL,_char_*,_false>._M_head_impl);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&info_log);
  }
  return 0;
}

Assistant:

GLuint compile_shader(const char *code, GLenum type) {
      GLuint id = glCreateShader(type);

      if (id == 0) {
        return 0;
      }

      // compile
      const char *source[1] = { code };
      glShaderSource(id, 1, source, nullptr);
      glCompileShader(id);

      // and check
      GLint compile_status = GL_FALSE;
      glGetShaderiv(id, GL_COMPILE_STATUS, &compile_status);

      if (compile_status == GL_FALSE) {
        GLint info_log_length = 0;
        glGetShaderiv(id, GL_INFO_LOG_LENGTH, &info_log_length);

        assert(info_log_length > 0);
        std::unique_ptr<char[]> info_log(new char[info_log_length]);
        glGetShaderInfoLog(id, info_log_length, nullptr, info_log.get());

        std::cerr << "Error while compiling shader: " << info_log.get() << std::endl;
        return 0;
      }

      return id;
    }